

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O0

void write_bdirect(char *outfile,int *a,int n,int nqx,int nqy,uchar *scratch,int bit)

{
  int in_ECX;
  int in_EDX;
  int *in_RSI;
  char *in_RDI;
  int in_R8D;
  uchar *in_R9;
  int in_stack_00000008;
  undefined4 in_stack_ffffffffffffffe0;
  
  output_nybble(in_RDI,0);
  qtree_onebit(in_RSI,in_EDX,in_ECX,in_R8D,in_R9,in_stack_00000008);
  output_nnybble((char *)in_RSI,in_EDX,(uchar *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0));
  return;
}

Assistant:

static void
write_bdirect(char *outfile, int a[], int n,int nqx, int nqy, unsigned char scratch[], int bit)
{

	/*
	 * Write the direct bitmap warning code
	 */
	output_nybble(outfile,0x0);
	/*
	 * Copy A to scratch array (again!), packing 4 bits/nybble
	 */
	qtree_onebit(a,n,nqx,nqy,scratch,bit);
	/*
	 * write to outfile
	 */
/*
int i;
	for (i = 0; i < ((nqx+1)/2) * ((nqy+1)/2); i++) {
		output_nybble(outfile,scratch[i]);
	}
*/
	output_nnybble(outfile, ((nqx+1)/2) * ((nqy+1)/2), scratch);

}